

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

int write_int(int val,char *a)

{
  char *a_local;
  int val_local;
  
  if (a == (char *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    *a = (char)val;
    a[1] = (char)((uint)val >> 8);
    a[2] = (char)((uint)val >> 0x10);
    a[3] = (char)((uint)val >> 0x18);
    a_local._4_4_ = 4;
  }
  return a_local._4_4_;
}

Assistant:

int write_int(int val, char *a) 
{
    if(a == nullptr)
    {
        return -1;
    }

    a[0] = val & 0xff;
    a[1] = (val >>8)  & 0xff;
    a[2] = (val >>16) & 0xff;
    a[3] = (val >>24) & 0xff;  
    return 4;
}